

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

AnalogConsumer * __thiscall
AbstractModuleClient::subscribeAnalogData
          (AbstractModuleClient *this,size_t buffersize,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *channels)

{
  SubType SVar1;
  network_pimpl *this_00;
  bool bVar2;
  AnalogConsumer *this_01;
  HFParsingInfo parseinfo;
  HighFreqDataType dt;
  allocator local_462;
  allocator local_461;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_460;
  string local_448;
  HFParsingInfo local_428;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  HFSubSockSettings local_368;
  HFParsingInfo local_2c0;
  HighFreqDataType local_280;
  HighFreqDataType local_1f0;
  HighFreqDataType local_160;
  HFSubSockSettings local_d0;
  
  std::__cxx11::string::string((string *)&local_388,"analogstream",(allocator *)&local_368);
  std::__cxx11::string::string((string *)&local_3a8,"Trodes",(allocator *)&local_280);
  bVar2 = MlmWrap::isHfTypeCurrentlySubbed(&this->super_MlmWrap,&local_388,&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_388);
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_3c8,"analogstream",(allocator *)&local_368);
    std::__cxx11::string::string((string *)&local_3e8,"Trodes",(allocator *)&local_280);
    this_01 = (AnalogConsumer *)MlmWrap::getHfSubObject(&this->super_MlmWrap,&local_3c8,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
  }
  else {
    this_00 = (this->super_MlmWrap).state;
    std::__cxx11::string::string((string *)&local_368,"analogstream",&local_461);
    std::__cxx11::string::string((string *)&local_428,"Trodes",&local_462);
    network_pimpl::find_hfdt(&local_280,this_00,(string *)&local_368,(string *)&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_368);
    bVar2 = HighFreqDataType::isValid(&local_280);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_460,channels);
      HighFreqDataType::getDataFormat_abi_cxx11_(&local_448,&local_280);
      MlmWrap::createAnalogParsingInfo(&local_428,&this->super_MlmWrap,&local_460,&local_448);
      std::__cxx11::string::~string((string *)&local_448);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_460);
      this_01 = (AnalogConsumer *)operator_new(0x458);
      HighFreqDataType::HighFreqDataType(&local_160,&local_280);
      HFParsingInfo::HFParsingInfo(&local_2c0,&local_428);
      AnalogConsumer::AnalogConsumer(this_01,&local_160,(int)buffersize,&local_2c0);
      HFParsingInfo::~HFParsingInfo(&local_2c0);
      HighFreqDataType::~HighFreqDataType(&local_160);
      HighFreqDataType::HighFreqDataType(&local_1f0,&local_280);
      SVar1 = (this_01->super_HFSubConsumer).super_HighFreqSub.sockType;
      HighFreqDataType::HighFreqDataType(&local_368.dataType,&local_1f0);
      local_368.userFoo = (hfs_data_callback_fn)0x0;
      local_368.args = (void *)0x0;
      local_368.subSockType = SVar1;
      HighFreqDataType::~HighFreqDataType(&local_1f0);
      MlmWrap::addSubToList(&this->super_MlmWrap,(HighFreqSub *)this_01);
      HFSubSockSettings::HFSubSockSettings(&local_d0,&local_368);
      MlmWrap::addHfTypeToSubbedList(&this->super_MlmWrap,&local_d0);
      HighFreqDataType::~HighFreqDataType(&local_d0.dataType);
      HighFreqDataType::~HighFreqDataType(&local_368.dataType);
      HFParsingInfo::~HFParsingInfo(&local_428);
    }
    else {
      this_01 = (AnalogConsumer *)0x0;
    }
    HighFreqDataType::~HighFreqDataType(&local_280);
  }
  return this_01;
}

Assistant:

AnalogConsumer* AbstractModuleClient::subscribeAnalogData(size_t buffersize, std::vector<std::string> channels){
    if(isHfTypeCurrentlySubbed(hfType_ANALOG, TRODES_NETWORK_ID)){
        return (AnalogConsumer*)getHfSubObject(hfType_ANALOG, TRODES_NETWORK_ID);
    }
    HighFreqDataType dt = state->find_hfdt(hfType_ANALOG, TRODES_NETWORK_ID);
    if(!dt.isValid()){
        // std::cerr << error("Analog data could not be found on the network!");
        return NULL;
    }
    HFParsingInfo parseinfo = createAnalogParsingInfo(channels, dt.getDataFormat());
    AnalogConsumer* newsub = new AnalogConsumer(dt, buffersize, parseinfo);
    HFSubSockSettings sockinfo(dt, newsub->getSubSockType(), NULL, NULL);
    addSubToList(newsub);
    addHfTypeToSubbedList(sockinfo);
    return newsub;
}